

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSharedPtr.hpp
# Opt level: O0

void __thiscall
de::SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_2>_>_>::SharedPtr
          (SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_2>_>_> *this,
          Expr<tcu::Matrix<float,_2,_2>_> *ptr)

{
  Expr<tcu::Matrix<float,_2,_2>_> *pEVar1;
  SharedPtrState<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_2>_>,_de::DefaultDeleter<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_2>_>_>_>
  *pSVar2;
  DefaultDeleter<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_2>_>_> local_25 [13];
  Expr<tcu::Matrix<float,_2,_2>_> *local_18;
  Expr<tcu::Matrix<float,_2,_2>_> *ptr_local;
  SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_2>_>_> *this_local;
  
  this->m_ptr = (Expr<tcu::Matrix<float,_2,_2>_> *)0x0;
  this->m_state = (SharedPtrStateBase *)0x0;
  this->m_ptr = ptr;
  local_18 = ptr;
  ptr_local = (Expr<tcu::Matrix<float,_2,_2>_> *)this;
  pSVar2 = (SharedPtrState<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_2>_>,_de::DefaultDeleter<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_2>_>_>_>
            *)operator_new(0x20);
  pEVar1 = local_18;
  DefaultDeleter<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_2>_>_>::DefaultDeleter
            (local_25);
  SharedPtrState<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_2>_>,_de::DefaultDeleter<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_2>_>_>_>
  ::SharedPtrState(pSVar2,pEVar1);
  this->m_state = (SharedPtrStateBase *)pSVar2;
  this->m_state->strongRefCount = 1;
  this->m_state->weakRefCount = 1;
  return;
}

Assistant:

inline SharedPtr<T>::SharedPtr (T* ptr)
	: m_ptr		(DE_NULL)
	, m_state	(DE_NULL)
{
	try
	{
		m_ptr	= ptr;
		m_state	= new SharedPtrState<T, DefaultDeleter<T> >(ptr, DefaultDeleter<T>());
		m_state->strongRefCount	= 1;
		m_state->weakRefCount	= 1;
	}
	catch (...)
	{
		// \note ptr is not released.
		delete m_state;
		throw;
	}
}